

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

void format_line_string(char *str,size_t len,int significant_figures,format_type format)

{
  char *format_str;
  format_type format_local;
  int significant_figures_local;
  size_t len_local;
  char *str_local;
  
  if (format == CLASSIC) {
    snprintf(str,len,"%s%d%s","%12.",(ulong)(uint)significant_figures,"f %12f %12d %12.2f\n");
  }
  else if (format == CSV) {
    snprintf(str,len,"%s%d%s","%.",(ulong)(uint)significant_figures,"f,%f,%d,%.2f\n");
  }
  else {
    snprintf(str,len,"%s%d%s","%12.",(ulong)(uint)significant_figures,"f %12f %12d %12.2f\n");
  }
  return;
}

Assistant:

static void format_line_string(char* str, size_t len, int significant_figures, format_type format)
{
#if defined(_MSC_VER)
#define snprintf _snprintf
#pragma warning(push)
#pragma warning(disable: 4996)
#endif
    const char* format_str = "%s%d%s";

    switch (format)
    {
        case CSV:
            snprintf(str, len, format_str, "%.", significant_figures, "f,%f,%d,%.2f\n");
            break;
        case CLASSIC:
            snprintf(str, len, format_str, "%12.", significant_figures, "f %12f %12d %12.2f\n");
            break;
        default:
            snprintf(str, len, format_str, "%12.", significant_figures, "f %12f %12d %12.2f\n");
    }
#if defined(_MSC_VER)
#undef snprintf
#pragma warning(pop)
#endif
}